

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.c
# Opt level: O2

int EncodeData(BrotliEncoderState *s,int is_last,int force_flush,size_t *out_size,uint8_t **output)

{
  MemoryManager *m;
  void *__s1;
  int *piVar1;
  byte prev_byte;
  uint64_t uVar2;
  uint64_t uVar3;
  H42 *pHVar4;
  H2 *pHVar5;
  H42 *pHVar6;
  H4 *pHVar7;
  H6 *pHVar8;
  H3 *pHVar9;
  H5 *pHVar10;
  H9 *pHVar11;
  H7 *pHVar12;
  undefined8 uVar13;
  BrotliEncoderMode BVar14;
  uint32_t uVar15;
  uint uVar16;
  int iVar17;
  size_t i;
  size_t sVar18;
  uint32_t *puVar19;
  uint8_t *puVar20;
  int *piVar21;
  Command *pCVar22;
  H54 *pHVar23;
  H8 *pHVar24;
  size_t sVar25;
  BrotliEncoderParams *pBVar26;
  uint16_t *puVar27;
  uint *puVar28;
  H40 *pHVar29;
  uint *puVar30;
  undefined1 *puVar31;
  char cVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  ulong uVar36;
  int iVar37;
  char *pcVar38;
  ulong uVar39;
  ulong uVar40;
  void *__s2;
  ushort uVar41;
  ushort uVar42;
  uint8_t *input;
  ulong uVar43;
  ushort uVar44;
  long lVar45;
  ulong uVar46;
  ulong uVar47;
  ulong uVar48;
  ulong uVar49;
  BrotliEncoderState *s_00;
  ContextType literal_context_mode;
  long lVar50;
  BrotliEncoderParams *pBVar51;
  size_t *psVar52;
  bool bVar53;
  double dVar54;
  double dVar55;
  double dVar56;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  size_t sVar61;
  ulong local_250;
  size_t storage_ix_1;
  BrotliEncoderParams *local_240;
  BrotliEncoderParams *local_238;
  H10 *local_230;
  double local_228;
  size_t local_220;
  int *local_218;
  size_t *local_210;
  BrotliEncoderState *local_208;
  size_t *local_200;
  Hashers *local_1f8;
  int local_1f0;
  uint local_1ec;
  double local_1e8;
  undefined8 uStack_1e0;
  double local_1d8;
  double dStack_1d0;
  uint32_t monogram_histo [3];
  uint local_1bc;
  double local_1b8;
  undefined8 uStack_1b0;
  double local_1a8;
  undefined8 auStack_1a0 [2];
  ulong local_190;
  uint local_188 [8];
  ulong local_168;
  ulong local_160;
  ulong local_158;
  uint8_t **local_150;
  size_t table_size;
  undefined8 uStack_140;
  undefined8 local_138;
  undefined8 uStack_130;
  undefined4 local_128;
  ulong local_118;
  size_t storage_ix;
  BlockSplit local_e0;
  BlockSplit local_b0;
  uint32_t *local_80;
  size_t sStack_78;
  uint32_t *local_70;
  size_t sStack_68;
  HistogramLiteral *local_60;
  size_t sStack_58;
  HistogramCommand *local_50;
  size_t sStack_48;
  HistogramDistance *local_40;
  size_t sStack_38;
  
  uVar40 = (ulong)(uint)is_last;
  uVar2 = s->input_pos_;
  uVar3 = s->last_processed_pos_;
  local_200 = out_size;
  local_150 = output;
  uVar15 = WrapPosition(uVar3);
  EnsureInitialized(s);
  if (s->is_last_block_emitted_ != 0) {
    return 0;
  }
  local_220 = CONCAT44(local_220._4_4_,force_flush);
  uVar49 = uVar2 - uVar3;
  if (is_last != 0) {
    s->is_last_block_emitted_ = 1;
  }
  uVar39 = (ulong)(s->ringbuffer_).mask_;
  pHVar4 = (H42 *)(s->ringbuffer_).buffer_;
  sVar18 = InputBlockSize(s);
  if (sVar18 < uVar49) {
    return 0;
  }
  m = &s->memory_manager_;
  uVar16 = (s->params).quality;
  uVar35 = (uint)uVar49;
  if (uVar16 == 1) {
    if (s->command_buf_ != (uint32_t *)0x0) goto LAB_0012a4e0;
    puVar19 = (uint32_t *)BrotliAllocate(m,0x80000);
    s->command_buf_ = puVar19;
    puVar20 = (uint8_t *)BrotliAllocate(m,0x20000);
    s->literal_buf_ = puVar20;
    uVar16 = (s->params).quality;
  }
  if (uVar16 < 2) {
LAB_0012a4e0:
    uVar16 = (uint)uVar39;
    storage_ix = (size_t)s->last_byte_bits_;
    if (is_last == 0 && uVar2 == uVar3) {
      sVar18 = 0;
    }
    else {
      puVar20 = GetBrotliStorage(s,(ulong)(uVar35 * 2 + 0x1f6));
      *puVar20 = s->last_byte_;
      uVar49 = uVar49 & 0xffffffff;
      piVar21 = GetHashTable(s,(s->params).quality,uVar49,&table_size);
      input = (uint8_t *)((long)pHVar4->addr + (ulong)(uVar16 & uVar15));
      if ((s->params).quality == 0) {
        BrotliCompressFragmentFast
                  (m,input,uVar49,is_last,piVar21,table_size,s->cmd_depths_,s->cmd_bits_,
                   &s->cmd_code_numbits_,s->cmd_code_,&storage_ix,puVar20);
      }
      else {
        BrotliCompressFragmentTwoPass
                  (m,input,uVar49,is_last,s->command_buf_,s->literal_buf_,piVar21,table_size,
                   &storage_ix,puVar20);
      }
      sVar18 = storage_ix >> 3;
      s->last_byte_ = puVar20[sVar18];
      s->last_byte_bits_ = (byte)storage_ix & 7;
      UpdateLastProcessedPos(s);
      *local_150 = puVar20;
    }
    *local_200 = sVar18;
    return 1;
  }
  uVar36 = s->num_commands_ + (uVar49 >> 1 & 0x7fffffff) + 1;
  if (s->cmd_alloc_size_ < uVar36) {
    sVar18 = (uVar49 >> 2 & 0x3fffffff) + uVar36 + 0x10;
    s->cmd_alloc_size_ = sVar18;
    if (sVar18 == 0) {
      pCVar22 = (Command *)0x0;
    }
    else {
      pCVar22 = (Command *)BrotliAllocate(m,sVar18 * 0x10);
    }
    if (s->commands_ != (Command *)0x0) {
      memcpy(pCVar22,s->commands_,s->num_commands_ << 4);
      BrotliFree(m,s->commands_);
    }
    s->commands_ = pCVar22;
    uVar16 = (s->params).quality;
  }
  local_1f8 = &s->hashers_;
  pBVar26 = (BrotliEncoderParams *)(ulong)uVar15;
  uVar49 = uVar49 & 0xffffffff;
  iVar17 = (int)uVar39;
  local_208 = s;
  if ((int)uVar16 < 10) {
    sVar18 = uVar39;
    if (uVar16 == 4) {
      if ((s->params).size_hint < 0x100000) {
switchD_0012aace_caseD_4:
        pHVar7 = (s->hashers_).h4;
        if (((is_last == 0) || (uVar15 != 0)) || (0x1000 < uVar35)) {
          if (pHVar7->is_dirty_ != 0) {
            memset(pHVar7,0,0x80014);
          }
        }
        else {
          for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
            puVar19 = pHVar7->buckets_ +
                      ((ulong)(*(long *)((long)pHVar4->addr + uVar40) * -0x42e1ca5843000000) >> 0x2f
                      );
            puVar19[0] = 0;
            puVar19[1] = 0;
            puVar19[2] = 0;
            puVar19[3] = 0;
          }
          if (uVar49 == 0) goto LAB_0012b88a;
          pHVar7->is_dirty_ = 0;
        }
        sVar18 = uVar39;
        if (2 < uVar15 && 6 < uVar35) {
          pHVar23 = (H54 *)(s->hashers_).h4;
          uVar16 = uVar15 - 3;
          uVar35 = (uint)uVar39;
          pHVar23->buckets_
          [(uint)((ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar16 & uVar35)) *
                         -0x42e1ca5843000000) >> 0x2f) + (uVar16 >> 3 & 3)] = uVar16;
          uVar16 = uVar15 - 2;
          pHVar23->buckets_
          [(uint)((ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar16 & uVar35)) *
                         -0x42e1ca5843000000) >> 0x2f) + (uVar16 >> 3 & 3)] = uVar16;
          uVar16 = (uint)((ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar15 - 1 & uVar35)) *
                                 -0x42e1ca5843000000) >> 0x2f);
LAB_0012acb8:
          uVar40 = (ulong)(uVar16 + (uVar15 - 1 >> 3 & 3));
LAB_0012acc2:
          pHVar23->buckets_[uVar40] = uVar15 - 1;
          sVar18 = uVar39;
        }
      }
      else {
        pHVar23 = (s->hashers_).h54;
        if (((is_last == 0) || (uVar15 != 0)) || (0x8000 < uVar35)) {
          if (pHVar23->is_dirty_ != 0) {
            memset(pHVar23,0,0x400014);
          }
        }
        else {
          for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
            puVar19 = pHVar23->buckets_ +
                      ((ulong)(*(long *)((long)pHVar4->addr + uVar40) * 0x35a7bd1e35a7bd00) >> 0x2c)
            ;
            puVar19[0] = 0;
            puVar19[1] = 0;
            puVar19[2] = 0;
            puVar19[3] = 0;
          }
          if (uVar49 == 0) goto LAB_0012b88a;
          pHVar23->is_dirty_ = 0;
        }
        sVar18 = uVar39;
        if (2 < uVar15 && 6 < uVar35) {
          pHVar23 = (s->hashers_).h54;
          uVar16 = uVar15 - 3;
          uVar35 = (uint)uVar39;
          pHVar23->buckets_
          [(uint)((ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar16 & uVar35)) *
                         0x35a7bd1e35a7bd00) >> 0x2c) + (uVar16 >> 3 & 3)] = uVar16;
          uVar16 = uVar15 - 2;
          pHVar23->buckets_
          [(uint)((ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar16 & uVar35)) *
                         0x35a7bd1e35a7bd00) >> 0x2c) + (uVar16 >> 3 & 3)] = uVar16;
          uVar16 = (uint)((ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar15 - 1 & uVar35)) *
                                 0x35a7bd1e35a7bd00) >> 0x2c);
          goto LAB_0012acb8;
        }
      }
    }
    else {
      uVar34 = uVar16;
      if ((((int)uVar16 < 5) || (0x10 < (s->params).lgwin)) ||
         (uVar34 = 0x2a - (uVar16 < 9), 6 < uVar16)) {
        switch(uVar34) {
        case 2:
          pHVar5 = local_1f8->h2;
          if (((is_last == 0) || (uVar15 != 0)) || (0x800 < uVar35)) {
            if (pHVar5->is_dirty_ != 0) {
              memset(pHVar5,0,0x40008);
            }
          }
          else {
            for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
              pHVar5->buckets_
              [(ulong)(*(long *)((long)pHVar4->addr + uVar40) * -0x42e1ca5843000000) >> 0x30] = 0;
            }
            if (uVar49 == 0) break;
            pHVar5->is_dirty_ = 0;
          }
          sVar18 = uVar39;
          if (2 < uVar15 && 6 < uVar35) {
            pHVar23 = (H54 *)local_1f8->h2;
            uVar16 = (uint)uVar39;
            pHVar23->buckets_
            [(ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar15 - 3 & uVar16)) *
                    -0x42e1ca5843000000) >> 0x30] = uVar15 - 3;
            pHVar23->buckets_
            [(ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar15 - 2 & uVar16)) *
                    -0x42e1ca5843000000) >> 0x30] = uVar15 - 2;
            uVar40 = (ulong)(*(long *)((long)pHVar4->addr + (ulong)(uVar15 - 1 & uVar16)) *
                            -0x42e1ca5843000000) >> 0x30;
            goto LAB_0012acc2;
          }
          break;
        case 3:
          pHVar9 = (s->hashers_).h3;
          if (((is_last == 0) || (uVar15 != 0)) || (0x800 < uVar35)) {
            if (pHVar9->is_dirty_ != 0) {
              memset(pHVar9,0,0x4000c);
            }
          }
          else {
            for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
              lVar50 = *(long *)((long)pHVar4->addr + uVar40);
              (pHVar9->buckets_ + ((ulong)(lVar50 * -0x42e1ca5843000000) >> 0x30))[0] = 0;
              (pHVar9->buckets_ + ((ulong)(lVar50 * -0x42e1ca5843000000) >> 0x30))[1] = 0;
            }
            if (uVar49 == 0) break;
            pHVar9->is_dirty_ = 0;
          }
          sVar18 = uVar39;
          if (2 < uVar15 && 6 < uVar35) {
            pHVar9 = (s->hashers_).h3;
            uVar16 = uVar15 - 3;
            uVar35 = (uint)uVar39;
            *(uint *)((long)pHVar9->buckets_ +
                     (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar4->addr +
                                                              (ulong)(uVar16 & uVar35)) *
                                                    -0x42e1ca5843000000) >> 0x30) +
                             (uint)((uVar16 >> 3 & 1) != 0)) * 4)) = uVar16;
            uVar16 = uVar15 - 2;
            *(uint *)((long)pHVar9->buckets_ +
                     (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar4->addr +
                                                              (ulong)(uVar16 & uVar35)) *
                                                    -0x42e1ca5843000000) >> 0x30) +
                             (uint)((uVar16 >> 3 & 1) != 0)) * 4)) = uVar16;
            uVar16 = uVar15 - 1;
            *(uint *)((long)pHVar9->buckets_ +
                     (ulong)(((uint)(ushort)((ulong)(*(long *)((long)pHVar4->addr +
                                                              (ulong)(uVar16 & uVar35)) *
                                                    -0x42e1ca5843000000) >> 0x30) +
                             (uint)((uVar16 >> 3 & 1) != 0)) * 4)) = uVar16;
          }
          break;
        case 4:
          goto switchD_0012aace_caseD_4;
        case 5:
          pHVar10 = (s->hashers_).h5;
          if (((is_last == 0) || (uVar15 != 0)) || (0x100 < uVar35)) {
            if (pHVar10->is_dirty_ != 0) {
              memset(pHVar10,0,0x8000);
              goto LAB_0012b479;
            }
          }
          else {
            for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
              pHVar10->num_[(uint)(*(int *)((long)pHVar4->addr + uVar40) * 0x1e35a7bd) >> 0x12] = 0;
            }
            if (uVar49 == 0) break;
LAB_0012b479:
            pHVar10->is_dirty_ = 0;
          }
          sVar18 = uVar39;
          if (2 < uVar15 && 2 < uVar35) {
            pHVar24 = (H8 *)(s->hashers_).h5;
            uVar35 = (uint)uVar39;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 3 & uVar35)) * 0x1e35a7bd
                           ) >> 0x12;
            uVar42 = pHVar24->num_[uVar16];
            *(uint32_t *)
             ((long)pHVar24->num_ + (ulong)(uVar16 * 0x40 + (uVar42 & 0xf) * 4) + 0x8000) =
                 uVar15 - 3;
            pHVar24->num_[uVar16] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 2 & uVar35)) * 0x1e35a7bd
                           ) >> 0x12;
            uVar42 = pHVar24->num_[uVar16];
            *(uint32_t *)
             ((long)pHVar24->num_ + (ulong)(uVar16 * 0x40 + (uVar42 & 0xf) * 4) + 0x8000) =
                 uVar15 - 2;
            pHVar24->num_[uVar16] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 1 & uVar35)) * 0x1e35a7bd
                           ) >> 0x12;
            uVar40 = (ulong)uVar16;
            uVar42 = pHVar24->num_[uVar40];
            uVar35 = uVar42 & 0xf;
            iVar17 = uVar16 << 6;
LAB_0012b52a:
            *(uint32_t *)((long)pHVar24->num_ + (ulong)(iVar17 + uVar35 * 4) + 0x8000) = uVar15 - 1;
LAB_0012b880:
            pHVar24->num_[uVar40] = uVar42 + 1;
            sVar18 = uVar39;
          }
          break;
        case 6:
          pHVar8 = (s->hashers_).h6;
          if (((is_last == 0) || (uVar15 != 0)) || (0x100 < uVar35)) {
            if (pHVar8->is_dirty_ != 0) {
              memset(pHVar8,0,0x8000);
              goto LAB_0012b28e;
            }
          }
          else {
            for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
              pHVar8->num_[(uint)(*(int *)((long)pHVar4->addr + uVar40) * 0x1e35a7bd) >> 0x12] = 0;
            }
            if (uVar49 == 0) break;
LAB_0012b28e:
            pHVar8->is_dirty_ = 0;
          }
          sVar18 = uVar39;
          if (2 < uVar15 && 2 < uVar35) {
            pHVar24 = (H8 *)(s->hashers_).h6;
            uVar35 = (uint)uVar39;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 3 & uVar35)) * 0x1e35a7bd
                           ) >> 0x12;
            uVar42 = pHVar24->num_[uVar16];
            *(uint32_t *)
             ((long)pHVar24->num_ + (ulong)(uVar16 * 0x80 + (uVar42 & 0x1f) * 4) + 0x8000) =
                 uVar15 - 3;
            pHVar24->num_[uVar16] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 2 & uVar35)) * 0x1e35a7bd
                           ) >> 0x12;
            uVar42 = pHVar24->num_[uVar16];
            *(uint32_t *)
             ((long)pHVar24->num_ + (ulong)(uVar16 * 0x80 + (uVar42 & 0x1f) * 4) + 0x8000) =
                 uVar15 - 2;
            pHVar24->num_[uVar16] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 1 & uVar35)) * 0x1e35a7bd
                           ) >> 0x12;
            uVar40 = (ulong)uVar16;
            uVar42 = pHVar24->num_[uVar40];
            uVar35 = uVar42 & 0x1f;
            iVar17 = uVar16 << 7;
            goto LAB_0012b52a;
          }
          break;
        case 7:
          pHVar12 = (s->hashers_).h7;
          if (((is_last == 0) || (uVar15 != 0)) || (0x200 < uVar35)) {
            if (pHVar12->is_dirty_ != 0) {
              memset(pHVar12,0,0x10000);
              goto LAB_0012b6e5;
            }
          }
          else {
            for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
              pHVar12->num_[(uint)(*(int *)((long)pHVar4->addr + uVar40) * 0x1e35a7bd) >> 0x11] = 0;
            }
            if (uVar49 == 0) break;
LAB_0012b6e5:
            pHVar12->is_dirty_ = 0;
          }
          sVar18 = uVar39;
          if (2 < uVar15 && 2 < uVar35) {
            pHVar24 = (H8 *)(s->hashers_).h7;
            uVar35 = (uint)uVar39;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 3 & uVar35)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar42 = pHVar24->num_[uVar16];
            *(uint32_t *)((long)pHVar24->buckets_ + (ulong)(uVar16 * 0x100 + (uVar42 & 0x3f) * 4)) =
                 uVar15 - 3;
            pHVar24->num_[uVar16] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 2 & uVar35)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar42 = pHVar24->num_[uVar16];
            *(uint32_t *)((long)pHVar24->buckets_ + (ulong)(uVar16 * 0x100 + (uVar42 & 0x3f) * 4)) =
                 uVar15 - 2;
            pHVar24->num_[uVar16] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 1 & uVar35)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar40 = (ulong)uVar16;
            uVar42 = pHVar24->num_[uVar40];
            uVar35 = uVar42 & 0x3f;
            iVar17 = uVar16 << 8;
LAB_0012b875:
            *(uint32_t *)((long)pHVar24->buckets_ + (ulong)(iVar17 + uVar35 * 4)) = uVar15 - 1;
            goto LAB_0012b880;
          }
          break;
        case 8:
          pHVar24 = (s->hashers_).h8;
          if (((is_last == 0) || (uVar15 != 0)) || (0x200 < uVar35)) {
            if (pHVar24->is_dirty_ != 0) {
              memset(pHVar24,0,0x10000);
              goto LAB_0012b7c4;
            }
          }
          else {
            for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
              pHVar24->num_[(uint)(*(int *)((long)pHVar4->addr + uVar40) * 0x1e35a7bd) >> 0x11] = 0;
            }
            if (uVar49 == 0) break;
LAB_0012b7c4:
            pHVar24->is_dirty_ = 0;
          }
          sVar18 = uVar39;
          if (2 < uVar15 && 2 < uVar35) {
            pHVar24 = (s->hashers_).h8;
            uVar35 = (uint)uVar39;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 3 & uVar35)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar42 = pHVar24->num_[uVar16];
            *(uint32_t *)((long)pHVar24->buckets_ + (ulong)(uVar16 * 0x200 + (uVar42 & 0x7f) * 4)) =
                 uVar15 - 3;
            pHVar24->num_[uVar16] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 2 & uVar35)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar42 = pHVar24->num_[uVar16];
            *(uint32_t *)((long)pHVar24->buckets_ + (ulong)(uVar16 * 0x200 + (uVar42 & 0x7f) * 4)) =
                 uVar15 - 2;
            pHVar24->num_[uVar16] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 1 & uVar35)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar40 = (ulong)uVar16;
            uVar42 = pHVar24->num_[uVar40];
            uVar35 = uVar42 & 0x7f;
            iVar17 = uVar16 << 9;
            goto LAB_0012b875;
          }
          break;
        case 9:
          pHVar11 = (s->hashers_).h9;
          if (((is_last == 0) || (uVar15 != 0)) || (0x200 < uVar35)) {
            if (pHVar11->is_dirty_ != 0) {
              memset(pHVar11,0,0x10000);
              goto LAB_0012b563;
            }
          }
          else {
            for (uVar40 = 0; uVar49 != uVar40; uVar40 = uVar40 + 1) {
              pHVar11->num_[(uint)(*(int *)((long)pHVar4->addr + uVar40) * 0x1e35a7bd) >> 0x11] = 0;
            }
            if (uVar49 == 0) break;
LAB_0012b563:
            pHVar11->is_dirty_ = 0;
          }
          sVar18 = uVar39;
          if (2 < uVar15 && 2 < uVar35) {
            pHVar11 = (s->hashers_).h9;
            uVar16 = (uint)uVar39;
            uVar35 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 3 & uVar16)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar42 = pHVar11->num_[uVar35];
            *(uint32_t *)((long)pHVar11->buckets_ + (ulong)(uVar35 * 0x400 + (uVar42 & 0xff) * 4)) =
                 uVar15 - 3;
            pHVar11->num_[uVar35] = uVar42 + 1;
            uVar35 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 2 & uVar16)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar42 = pHVar11->num_[uVar35];
            *(uint32_t *)((long)pHVar11->buckets_ + (ulong)(uVar35 * 0x400 + (uVar42 & 0xff) * 4)) =
                 uVar15 - 2;
            pHVar11->num_[uVar35] = uVar42 + 1;
            uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)(uVar15 - 1 & uVar16)) * 0x1e35a7bd
                           ) >> 0x11;
            uVar42 = pHVar11->num_[uVar16];
            *(uint32_t *)((long)pHVar11->buckets_ + (ulong)(uVar16 * 0x400 + (uVar42 & 0xff) * 4)) =
                 uVar15 - 1;
            pHVar11->num_[uVar16] = uVar42 + 1;
          }
          break;
        default:
          if (uVar34 == 0x29) {
            InitH41((MemoryManager *)(s->hashers_).h41,(H41 *)pHVar4,(uint8_t *)s,pBVar26,uVar49,
                    uVar40,iVar17);
            sVar18 = uVar39;
            if (2 < uVar15 && 2 < uVar49) {
              pHVar29 = (H40 *)(s->hashers_).h41;
              goto LAB_0012af1c;
            }
          }
          else if ((uVar34 == 0x2a) &&
                  (InitH42((MemoryManager *)(s->hashers_).h42,pHVar4,(uint8_t *)s,pBVar26,uVar49,
                           uVar40,iVar17), sVar18 = uVar39, 2 < uVar15 && 2 < uVar49)) {
            pHVar6 = (s->hashers_).h42;
            puVar31 = &pBVar26[-1].field_0x1d;
            uVar16 = (uint)uVar39;
            uVar35 = (uint)(*(int *)((long)pHVar4->addr + (ulong)((uint)puVar31 & uVar16)) *
                           0x1e35a7bd) >> 0x11;
            uVar34 = uVar35 & 0x1ff;
            uVar42 = pHVar6->free_slot_idx[uVar34];
            pHVar6->free_slot_idx[uVar34] = uVar42 + 1;
            uVar40 = (ulong)uVar42 & 0x1ff;
            uVar36 = (long)puVar31 - (ulong)pHVar6->addr[uVar35];
            pHVar6->tiny_hash[(ulong)puVar31 & 0xffff] = (uint8_t)uVar35;
            if (0xfffe < uVar36) {
              uVar36 = 0xffff;
            }
            *(short *)((long)&pHVar6->banks[0].slots[uVar40].delta + (ulong)(uVar34 << 0xb)) =
                 (short)uVar36;
            *(uint16_t *)((long)&pHVar6->banks[0].slots[uVar40].next + (ulong)(uVar34 << 0xb)) =
                 pHVar6->head[uVar35];
            pHVar6->addr[uVar35] = (uint)puVar31;
            pHVar6->head[uVar35] = (uint16_t)uVar40;
            puVar31 = &pBVar26[-1].field_0x1e;
            uVar35 = (uint)(*(int *)((long)pHVar4->addr + (ulong)((uint)puVar31 & uVar16)) *
                           0x1e35a7bd) >> 0x11;
            uVar34 = uVar35 & 0x1ff;
            uVar42 = pHVar6->free_slot_idx[uVar34];
            pHVar6->free_slot_idx[uVar34] = uVar42 + 1;
            uVar36 = (ulong)uVar42 & 0x1ff;
            uVar40 = (long)puVar31 - (ulong)pHVar6->addr[uVar35];
            pHVar6->tiny_hash[(ulong)puVar31 & 0xffff] = (uint8_t)uVar35;
            if (0xfffe < uVar40) {
              uVar40 = 0xffff;
            }
            *(short *)((long)&pHVar6->banks[0].slots[uVar36].delta + (ulong)(uVar34 << 0xb)) =
                 (short)uVar40;
            *(uint16_t *)((long)&pHVar6->banks[0].slots[uVar36].next + (ulong)(uVar34 << 0xb)) =
                 pHVar6->head[uVar35];
            pHVar6->addr[uVar35] = (uint)puVar31;
            pHVar6->head[uVar35] = (uint16_t)uVar36;
            puVar31 = &pBVar26[-1].field_0x1f;
            uVar35 = (uint)(*(int *)((long)pHVar4->addr + (ulong)((uint)puVar31 & uVar16)) *
                           0x1e35a7bd) >> 0x11;
            uVar16 = uVar35 & 0x1ff;
            uVar42 = pHVar6->free_slot_idx[uVar16];
            pHVar6->free_slot_idx[uVar16] = uVar42 + 1;
            uVar40 = (ulong)uVar42 & 0x1ff;
            uVar36 = (long)puVar31 - (ulong)pHVar6->addr[uVar35];
            pHVar6->tiny_hash[(ulong)puVar31 & 0xffff] = (uint8_t)uVar35;
            if (0xfffe < uVar36) {
              uVar36 = 0xffff;
            }
            *(short *)((long)&pHVar6->banks[0].slots[uVar40].delta + (ulong)(uVar16 << 0xb)) =
                 (short)uVar36;
            *(uint16_t *)((long)&pHVar6->banks[0].slots[uVar40].next + (ulong)(uVar16 << 0xb)) =
                 pHVar6->head[uVar35];
            pHVar6->addr[uVar35] = (uint)puVar31;
            pHVar6->head[uVar35] = (uint16_t)uVar40;
          }
        }
      }
      else {
        InitH40((MemoryManager *)(s->hashers_).h40,(H40 *)pHVar4,(uint8_t *)s,pBVar26,uVar49,uVar40,
                iVar17);
        sVar18 = uVar39;
        if (2 < uVar15 && 2 < uVar49) {
          pHVar29 = (s->hashers_).h40;
LAB_0012af1c:
          puVar31 = &pBVar26[-1].field_0x1d;
          uVar35 = (uint)uVar39;
          uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)((uint)puVar31 & uVar35)) *
                         0x1e35a7bd) >> 0x11;
          uVar42 = pHVar29->free_slot_idx[0];
          uVar44 = uVar42 + 1;
          pHVar29->free_slot_idx[0] = uVar44;
          uVar40 = (long)puVar31 - (ulong)pHVar29->addr[uVar16];
          if (0xfffe < uVar40) {
            uVar40 = 0xffff;
          }
          pHVar29->tiny_hash[(ulong)puVar31 & 0xffff] = (uint8_t)uVar16;
          pHVar29->banks[0].slots[uVar42].delta = (uint16_t)uVar40;
          pHVar29->banks[0].slots[uVar42].next = pHVar29->head[uVar16];
          pHVar29->addr[uVar16] = (uint)puVar31;
          pHVar29->head[uVar16] = uVar42;
          puVar31 = &pBVar26[-1].field_0x1e;
          uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)((uint)puVar31 & uVar35)) *
                         0x1e35a7bd) >> 0x11;
          uVar41 = uVar42 + 2;
          pHVar29->free_slot_idx[0] = uVar41;
          uVar40 = (long)puVar31 - (ulong)pHVar29->addr[uVar16];
          pHVar29->tiny_hash[(ulong)puVar31 & 0xffff] = (uint8_t)uVar16;
          if (0xfffe < uVar40) {
            uVar40 = 0xffff;
          }
          pHVar29->banks[0].slots[uVar44].delta = (uint16_t)uVar40;
          pHVar29->banks[0].slots[uVar44].next = pHVar29->head[uVar16];
          pHVar29->addr[uVar16] = (uint)puVar31;
          pHVar29->head[uVar16] = uVar44;
          puVar31 = &pBVar26[-1].field_0x1f;
          uVar16 = (uint)(*(int *)((long)pHVar4->addr + (ulong)((uint)puVar31 & uVar35)) *
                         0x1e35a7bd) >> 0x11;
          pHVar29->free_slot_idx[0] = uVar42 + 3;
          uVar40 = (long)puVar31 - (ulong)pHVar29->addr[uVar16];
          if (0xfffe < uVar40) {
            uVar40 = 0xffff;
          }
          pHVar29->tiny_hash[(ulong)puVar31 & 0xffff] = (uint8_t)uVar16;
          pHVar29->banks[0].slots[uVar41].delta = (uint16_t)uVar40;
          pHVar29->banks[0].slots[uVar41].next = pHVar29->head[uVar16];
          pHVar29->addr[uVar16] = (uint)puVar31;
          pHVar29->head[uVar16] = uVar41;
          sVar18 = uVar39;
        }
      }
    }
  }
  else {
    InitH10(m,(s->hashers_).h10,(uint8_t *)s,pBVar26,uVar49,uVar40,iVar17);
    sVar18 = uVar39;
    if (0x7f < uVar15 && 2 < uVar49) {
      local_230 = (s->hashers_).h10;
      pBVar51 = (BrotliEncoderParams *)((long)&pBVar26[-4].mode + 1);
      local_238 = (BrotliEncoderParams *)((long)pBVar26 + (uVar49 - 0x7f));
      local_240 = pBVar26;
      if (pBVar26 < local_238) {
        local_238 = pBVar26;
      }
      for (; pBVar26 = local_240, pBVar51 < local_238;
          pBVar51 = (BrotliEncoderParams *)((long)&pBVar51->mode + 1)) {
        local_1e8 = (double)local_230->window_mask_;
        uVar40 = (long)local_240 - (long)pBVar51;
        if ((ulong)((long)local_240 - (long)pBVar51) < 0x10) {
          uVar40 = 0xf;
        }
        local_1b8 = (double)((long)local_1e8 - uVar40);
        uVar40 = (ulong)((uint)pBVar51 & (uint)uVar39);
        __s1 = (void *)((long)pHVar4->addr + uVar40);
        uVar16 = (uint)(*(int *)((long)pHVar4->addr + uVar40) * 0x1e35a7bd) >> 0xf;
        uVar15 = local_230->buckets_[uVar16];
        local_218 = (int *)(((ulong)local_1e8 & (ulong)pBVar51) * 2 + 1);
        local_250 = ((ulong)local_1e8 & (ulong)pBVar51) * 2;
        local_230->buckets_[uVar16] = (uint)pBVar51;
        uVar40 = 0;
        local_210 = (size_t *)0x0;
        lVar50 = 0x40;
        while (pBVar51 != (BrotliEncoderParams *)(ulong)uVar15) {
          bVar53 = lVar50 == 0;
          lVar50 = lVar50 + -1;
          if (((ulong)local_1b8 < (ulong)((long)pBVar51 - (long)(ulong)uVar15)) || (bVar53)) break;
          uVar36 = (ulong)local_210;
          if (uVar40 < local_210) {
            uVar36 = uVar40;
          }
          if (0x80 < uVar36) {
            __assert_fail("cur_len <= MAX_TREE_COMP_LENGTH",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                          ,0x9d,
                          "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                         );
          }
          local_1d8 = (double)CONCAT44(local_1d8._4_4_,uVar15);
          __s2 = (void *)((long)pHVar4->addr + (ulong)(uVar15 & (uint)uVar39));
          uVar39 = 0x80 - uVar36;
          uVar43 = (ulong)((uint)uVar39 & 0xf8);
          uVar47 = 0;
          lVar45 = 0;
LAB_0012a873:
          if (uVar39 >> 3 == uVar47) {
            uVar46 = (ulong)((uint)uVar39 & 7);
            pcVar38 = (char *)((long)__s2 + (uVar36 - lVar45));
            for (; (bVar53 = uVar46 != 0, uVar46 = uVar46 - 1, uVar47 = uVar39, bVar53 &&
                   (uVar47 = uVar43, *(char *)((long)__s1 + uVar43 + uVar36) == *pcVar38));
                uVar43 = uVar43 + 1) {
              pcVar38 = pcVar38 + 1;
            }
          }
          else {
            uVar46 = *(ulong *)((long)__s2 + uVar47 * 8 + uVar36);
            uVar48 = *(ulong *)((long)__s1 + uVar47 * 8 + uVar36);
            if (uVar46 == uVar48) goto code_r0x0012a889;
            uVar48 = uVar48 ^ uVar46;
            uVar39 = 0;
            if (uVar48 != 0) {
              for (; (uVar48 >> uVar39 & 1) == 0; uVar39 = uVar39 + 1) {
              }
            }
            uVar47 = (uVar39 >> 3 & 0x1fffffff) - lVar45;
          }
          uVar47 = uVar47 + uVar36;
          uVar39 = sVar18;
          iVar17 = bcmp(__s1,__s2,uVar47);
          if (iVar17 != 0) {
            __assert_fail("0 == memcmp(&data[cur_ix_masked], &data[prev_ix_masked], len)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/./././hash_to_binary_tree_inc.h"
                          ,0xa2,
                          "BackwardMatch *StoreAndFindMatchesH10(H10 *, const uint8_t *const restrict, const size_t, const size_t, const size_t, const size_t, size_t *const restrict, BackwardMatch *restrict)"
                         );
          }
          sVar18 = uVar39;
          if (0x7f < uVar47) {
            puVar19 = local_230->forest_;
            puVar19[local_250] = puVar19[(ulong)(local_1e8._0_4_ & uVar15) * 2];
            uVar15 = puVar19[(ulong)(local_1e8._0_4_ & uVar15) * 2 + 1];
            goto LAB_0012a9aa;
          }
          uVar36 = (ulong)(uVar15 & local_1e8._0_4_) * 2;
          puVar19 = local_230->forest_;
          if (*(byte *)((long)__s2 + uVar47) < *(byte *)((long)__s1 + uVar47)) {
            puVar19[local_250] = local_1d8._0_4_;
            uVar36 = uVar36 | 1;
            uVar40 = uVar47;
            local_250 = uVar36;
          }
          else {
            puVar19[(long)local_218] = local_1d8._0_4_;
            local_210 = (size_t *)uVar47;
            local_218 = (int *)uVar36;
          }
          uVar15 = puVar19[uVar36];
        }
        uVar15 = local_230->invalid_pos_;
        puVar19 = local_230->forest_;
        puVar19[local_250] = uVar15;
LAB_0012a9aa:
        puVar19[(long)local_218] = uVar15;
        s = local_208;
      }
    }
  }
LAB_0012b88a:
  local_210 = &s->num_commands_;
  iVar17 = (s->params).quality;
  if (iVar17 == 0xb) {
    BrotliCreateHqZopfliBackwardReferences
              (m,uVar49,(size_t)pBVar26,(uint8_t *)pHVar4,uVar39,&s->params,(s->hashers_).h10,
               s->dist_cache_,&s->last_insert_len_,s->commands_ + s->num_commands_,local_210,
               &s->num_literals_);
  }
  else if (iVar17 == 10) {
    BrotliCreateZopfliBackwardReferences
              (m,uVar49,(size_t)pBVar26,(uint8_t *)pHVar4,sVar18,&s->params,(s->hashers_).h10,
               s->dist_cache_,&s->last_insert_len_,s->commands_ + s->num_commands_,local_210,
               &s->num_literals_);
  }
  else {
    BrotliCreateBackwardReferences
              (uVar49,(size_t)pBVar26,(uint8_t *)pHVar4,sVar18,&s->params,local_1f8,s->dist_cache_,
               &s->last_insert_len_,s->commands_ + s->num_commands_,local_210,&s->num_literals_);
  }
  iVar17 = (s->params).lgwin;
  iVar37 = (s->params).lgblock;
  if (iVar37 < iVar17) {
    iVar37 = iVar17;
  }
  cVar32 = '\x17';
  if (iVar37 < 0x17) {
    cVar32 = (char)iVar37;
  }
  uVar40 = 1L << (cVar32 + 1U & 0x3f);
  uVar2 = s->input_pos_;
  uVar3 = s->last_flush_pos_;
  sVar25 = InputBlockSize(s);
  s_00 = local_208;
  if ((s->params).quality < 4) {
    bVar53 = 0x2ffe < s->num_commands_ + s->num_literals_;
  }
  else {
    bVar53 = false;
  }
  if ((((int)local_220 == 0 && is_last == 0) && (!bVar53)) &&
     (((uVar2 - uVar3) + sVar25 <= uVar40 &&
      ((uVar40 = uVar40 >> 3, s->num_literals_ < uVar40 && (*local_210 < uVar40)))))) {
    iVar17 = UpdateLastProcessedPos(s);
    if (iVar17 == 0) goto LAB_0012cd52;
    uVar16 = (s->params).quality;
    if (9 < (int)uVar16) {
      ((s->hashers_).h10)->is_dirty_ = 1;
      goto LAB_0012cd52;
    }
    if (uVar16 == 4) {
      if (0xfffff < (s->params).size_hint) {
        pHVar23 = (s->hashers_).h54;
        pHVar23->is_dirty_ = 1;
        (pHVar23->dict_search_stats_).num_lookups = 0;
        (pHVar23->dict_search_stats_).num_matches = 0;
        goto LAB_0012cd52;
      }
switchD_0012c318_caseD_4:
      pHVar7 = (s->hashers_).h4;
      pHVar7->is_dirty_ = 1;
      (pHVar7->dict_search_stats_).num_lookups = 0;
      (pHVar7->dict_search_stats_).num_matches = 0;
      goto LAB_0012cd52;
    }
    uVar35 = uVar16;
    if ((((int)uVar16 < 5) || (0x10 < (s->params).lgwin)) ||
       (uVar35 = 0x2a - (uVar16 < 9), 6 < uVar16)) {
      switch(uVar35) {
      case 2:
        pHVar5 = local_1f8->h2;
        pHVar5->is_dirty_ = 1;
        (pHVar5->dict_search_stats_).num_lookups = 0;
        (pHVar5->dict_search_stats_).num_matches = 0;
        break;
      case 3:
        pHVar9 = (s->hashers_).h3;
        pHVar9->is_dirty_ = 1;
        (pHVar9->dict_search_stats_).num_lookups = 0;
        (pHVar9->dict_search_stats_).num_matches = 0;
        break;
      case 4:
        goto switchD_0012c318_caseD_4;
      case 5:
        pHVar10 = (s->hashers_).h5;
        pHVar10->is_dirty_ = 1;
        (pHVar10->dict_search_stats_).num_lookups = 0;
        (pHVar10->dict_search_stats_).num_matches = 0;
        break;
      case 6:
        pHVar8 = (s->hashers_).h6;
        pHVar8->is_dirty_ = 1;
        (pHVar8->dict_search_stats_).num_lookups = 0;
        (pHVar8->dict_search_stats_).num_matches = 0;
        break;
      case 7:
        pHVar12 = (s->hashers_).h7;
        pHVar12->is_dirty_ = 1;
        (pHVar12->dict_search_stats_).num_lookups = 0;
        (pHVar12->dict_search_stats_).num_matches = 0;
        break;
      case 8:
        pHVar24 = (s->hashers_).h8;
        pHVar24->is_dirty_ = 1;
        (pHVar24->dict_search_stats_).num_lookups = 0;
        (pHVar24->dict_search_stats_).num_matches = 0;
        break;
      case 9:
        pHVar11 = (s->hashers_).h9;
        pHVar11->is_dirty_ = 1;
        (pHVar11->dict_search_stats_).num_lookups = 0;
        (pHVar11->dict_search_stats_).num_matches = 0;
        break;
      default:
        if (uVar35 != 0x29) {
          if (uVar35 == 0x2a) {
            pHVar4 = (s->hashers_).h42;
            pHVar4->is_dirty_ = 1;
            (pHVar4->dict_search_stats_).num_lookups = 0;
            (pHVar4->dict_search_stats_).num_matches = 0;
          }
          break;
        }
        pHVar29 = (H40 *)(s->hashers_).h41;
        goto LAB_0012cc8e;
      }
    }
    else {
      pHVar29 = (s->hashers_).h40;
LAB_0012cc8e:
      pHVar29->is_dirty_ = 1;
      (pHVar29->dict_search_stats_).num_lookups = 0;
      (pHVar29->dict_search_stats_).num_matches = 0;
    }
LAB_0012cd52:
    *local_200 = 0;
    return 1;
  }
  uVar40 = s->last_insert_len_;
  if (uVar40 != 0) {
    pCVar22 = s->commands_;
    sVar25 = s->num_commands_;
    s->num_commands_ = sVar25 + 1;
    pCVar22[sVar25].insert_len_ = (uint32_t)uVar40;
    pCVar22[sVar25].copy_len_ = 0x4000000;
    pCVar22[sVar25].dist_extra_ = 0;
    pCVar22[sVar25].dist_prefix_ = 0x10;
    if (uVar40 < 6) {
      uVar49 = uVar40 & 0xffffffff;
    }
    else if (uVar40 < 0x82) {
      uVar16 = 0x1f;
      uVar35 = (uint)(uVar40 - 2);
      if (uVar35 != 0) {
        for (; uVar35 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar49 = (ulong)((int)(uVar40 - 2 >> ((char)(uVar16 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar16 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar40 < 0x842) {
      uVar35 = (uint32_t)uVar40 - 0x42;
      uVar16 = 0x1f;
      if (uVar35 != 0) {
        for (; uVar35 >> uVar16 == 0; uVar16 = uVar16 - 1) {
        }
      }
      uVar49 = (ulong)((uVar16 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar49 = 0x15;
      if (0x1841 < uVar40) {
        uVar49 = (ulong)(ushort)(0x17 - (uVar40 < 0x5842));
      }
    }
    pCVar22[sVar25].cmd_prefix_ =
         (short)uVar49 * 8 & 0x38U |
         *(ushort *)
          (CombineLengthCodes_cells + (ulong)(uint)((int)((uVar49 & 0xffff) >> 3) * 3) * 2) | 2;
    s->num_literals_ = s->num_literals_ + uVar40;
    s->last_insert_len_ = 0;
  }
  uVar40 = s->input_pos_;
  uVar49 = s->last_flush_pos_;
  if (uVar40 == uVar49 && is_last == 0) {
    *local_200 = 0;
    return 1;
  }
  if (uVar40 < uVar49) {
    __assert_fail("s->input_pos_ >= s->last_flush_pos_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                  ,0x3bf,
                  "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                 );
  }
  uVar39 = uVar40 - uVar49;
  if ((uVar40 < uVar49 || uVar39 == 0) && is_last == 0) {
    __assert_fail("s->input_pos_ > s->last_flush_pos_ || is_last",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                  ,0x3c0,
                  "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                 );
  }
  local_220 = 1;
  if (0x1000000 < uVar39) {
    __assert_fail("s->input_pos_ - s->last_flush_pos_ <= 1u << 24",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                  ,0x3c1,
                  "int EncodeData(BrotliEncoderState *, const int, const int, size_t *, uint8_t **)"
                 );
  }
  pBVar26 = (BrotliEncoderParams *)GetBrotliStorage(local_208,uVar39 * 2 + 0x1f6);
  storage_ix_1 = (size_t)s_00->last_byte_bits_;
  *(uint8_t *)&pBVar26->mode = s_00->last_byte_;
  uVar2 = s_00->last_flush_pos_;
  prev_byte = s_00->prev_byte_;
  local_1d8 = (double)CONCAT71(local_1d8._1_7_,s_00->prev_byte2_);
  local_238 = (BrotliEncoderParams *)s_00->commands_;
  sVar25 = s_00->num_commands_;
  local_230 = (H10 *)s_00->saved_dist_cache_;
  local_218 = s_00->dist_cache_;
  uVar15 = WrapPosition(uVar2);
  sVar61 = sVar18;
  if (uVar40 == uVar49) {
    *(ulong *)((long)&pBVar26->mode + (storage_ix_1 >> 3)) =
         3L << ((byte)storage_ix_1 & 7) |
         (ulong)*(byte *)((long)&pBVar26->mode + (storage_ix_1 >> 3));
    storage_ix_1 = (size_t)((int)storage_ix_1 + 9U & 0xfffffff8);
    psVar52 = local_200;
  }
  else {
    local_240 = pBVar26;
    iVar17 = ShouldCompress((uint8_t *)pHVar4,sVar18,uVar2,uVar39,s_00->num_literals_,sVar25);
    psVar52 = local_200;
    pBVar26 = local_240;
    uVar40 = (ulong)uVar15;
    if (iVar17 == 0) {
      uVar13 = *(undefined8 *)((long)local_230 + 8);
      *(undefined8 *)local_218 = local_230->window_mask_;
      *(undefined8 *)(local_218 + 2) = uVar13;
    }
    else {
      BVar14 = local_240->mode;
      uVar43 = storage_ix_1 & 0xff;
      iVar17 = (s_00->params).quality;
      uVar36 = 0;
      uVar49 = 0;
      if (iVar17 < 10) {
LAB_0012be38:
        if (iVar17 < 3) {
          BrotliStoreMetaBlockFast
                    (m,(uint8_t *)pHVar4,uVar40,uVar39,sVar61,is_last,(Command *)local_238,sVar25,
                     &storage_ix_1,(uint8_t *)local_240);
          sVar18 = sVar61;
        }
        else {
          if (iVar17 != 3) goto LAB_0012beb3;
          BrotliStoreMetaBlockTrivial
                    (m,(uint8_t *)pHVar4,uVar40,uVar39,sVar61,is_last,(Command *)local_238,sVar25,
                     &storage_ix_1,(uint8_t *)local_240);
          sVar18 = sVar61;
        }
      }
      else {
        uVar36 = 0;
        uVar49 = 0;
        if ((s_00->params).mode == BROTLI_MODE_FONT) {
          puVar27 = (uint16_t *)((long)local_238 + 0xe);
          sVar18 = sVar25;
          while (bVar53 = sVar18 != 0, sVar18 = sVar18 - 1, bVar53) {
            if (((*(uint *)(puVar27 + -5) & 0xffffff) != 0) && (0x7f < puVar27[-1])) {
              uVar42 = *puVar27;
              uVar16 = (uint)uVar42;
              if (0xf < uVar42) {
                uVar16 = *(uint *)(puVar27 + -3);
                uVar16 = ((uint)uVar42 + (uVar16 >> 0x18) * -2 + -0xc <<
                         ((byte)(uVar16 >> 0x18) & 0x1f)) + (uVar16 & 0xffffff) + 0xc;
              }
              if (uVar16 < 0x1c) {
                uVar35 = 0;
              }
              else {
                uVar49 = (ulong)uVar16;
                uVar35 = 0x1f;
                uVar34 = (uint)(uVar49 - 0x14);
                if (uVar34 != 0) {
                  for (; uVar34 >> uVar35 == 0; uVar35 = uVar35 - 1) {
                  }
                }
                uVar33 = (uVar35 ^ 0xffffffe0) + 0x1f;
                bVar53 = (uVar34 >> (uVar33 & 0x1f) & 1) != 0;
                uVar16 = (uVar16 & 1) + (uint)bVar53 * 2 + (uVar35 ^ 0xffffffe0) * 4 + 0x90;
                uVar35 = (uint)((uVar49 - 0x14) - ((ulong)bVar53 + 2 << ((byte)uVar33 & 0x3f)) >> 1)
                         | uVar33 * 0x1000000 - 0x1000000;
              }
              *puVar27 = (ushort)uVar16;
              *(uint *)(puVar27 + -3) = uVar35;
            }
            puVar27 = puVar27 + 8;
          }
          iVar17 = (s_00->params).quality;
          uVar49 = 1;
          uVar36 = 0xc;
          goto LAB_0012be38;
        }
LAB_0012beb3:
        local_160 = uVar49;
        local_158 = uVar36;
        local_118 = uVar43;
        BrotliInitBlockSplit((BlockSplit *)&storage_ix);
        BrotliInitBlockSplit(&local_e0);
        BrotliInitBlockSplit(&local_b0);
        local_40 = (HistogramDistance *)0x0;
        sStack_38 = 0;
        local_50 = (HistogramCommand *)0x0;
        sStack_48 = 0;
        local_60 = (HistogramLiteral *)0x0;
        sStack_58 = 0;
        local_70 = (uint32_t *)0x0;
        sStack_68 = 0;
        local_80 = (uint32_t *)0x0;
        sStack_78 = 0;
        iVar17 = (s_00->params).quality;
        local_168 = uVar40;
        local_190 = (ulong)local_1d8 & 0xff;
        local_1ec = (uint)prev_byte;
        if (iVar17 < 10) {
          local_1f0 = iVar17;
          if (((s_00->params).disable_literal_context_modeling == 0) &&
             (0x3f < uVar39 && 4 < iVar17)) {
            local_220 = 3;
            puVar30 = monogram_histo + 1;
            uVar36 = uVar39 + uVar40;
            local_138 = 0;
            uStack_130 = 0;
            table_size = 0;
            uStack_140 = 0;
            local_128 = 0;
            uVar49 = uVar40 + 1;
            for (; uVar40 + 0x40 <= uVar36; uVar40 = uVar40 + 0x1000) {
              piVar21 = (int *)(DecideOverLiteralContextModeling_lut +
                               (ulong)(*(byte *)((long)pHVar4->addr +
                                                (ulong)((uint)uVar40 & (uint)sVar61)) >> 6) * 4);
              for (uVar43 = uVar49; uVar43 < uVar40 + 0x40; uVar43 = uVar43 + 1) {
                iVar17 = *piVar21;
                piVar21 = (int *)(DecideOverLiteralContextModeling_lut +
                                 (ulong)(*(byte *)((long)pHVar4->addr +
                                                  (ulong)((uint)uVar43 & (uint)sVar61)) >> 6) * 4);
                piVar1 = (int *)((long)&table_size + ((long)*piVar21 + (long)iVar17 * 3) * 4);
                *piVar1 = *piVar1 + 1;
              }
              uVar49 = uVar49 + 0x1000;
            }
            puVar19 = monogram_histo;
            monogram_histo[2] = 0;
            monogram_histo[0] = 0;
            monogram_histo[1] = 0;
            local_188[0] = 0;
            local_188[1] = 0;
            local_188[2] = 0;
            local_188[3] = 0;
            local_188[4] = 0;
            local_188[5] = 0;
            for (uVar40 = 0; uVar40 != 9; uVar40 = uVar40 + 1) {
              iVar17 = *(int *)((long)&table_size + uVar40 * 4);
              puVar19[(uVar40 / 3) * -3] = puVar19[(uVar40 / 3) * -3] + iVar17;
              uVar49 = uVar40;
              if (5 < uVar40) {
                uVar49 = uVar40 - 6;
              }
              local_188[uVar49] = local_188[uVar49] + iVar17;
              puVar19 = puVar19 + 1;
            }
            bVar53 = true;
            puVar28 = monogram_histo;
            local_1a8 = 0.0;
            auStack_1a0[0] = 0;
            lVar50 = 0;
            while( true ) {
              uVar40 = (ulong)*puVar28;
              if (uVar40 < 0x100) {
                dVar54 = (double)kLog2Table[uVar40];
              }
              else {
                dVar54 = log2((double)uVar40);
              }
              uVar49 = lVar50 + uVar40;
              local_1a8 = local_1a8 - (double)uVar40 * dVar54;
              if (!bVar53) break;
              uVar40 = (ulong)*puVar30;
              if (uVar40 < 0x100) {
                dVar54 = (double)kLog2Table[uVar40];
              }
              else {
                dVar54 = log2((double)uVar40);
              }
              lVar50 = uVar49 + uVar40;
              local_1a8 = local_1a8 - (double)uVar40 * dVar54;
              bVar53 = false;
              puVar28 = monogram_histo + 2;
              puVar30 = &local_1bc;
            }
            if (uVar49 != 0) {
              auVar57._8_4_ = (int)(uVar49 >> 0x20);
              auVar57._0_8_ = uVar49;
              auVar57._12_4_ = 0x45300000;
              dVar54 = (auVar57._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar49) - 4503599627370496.0);
              if (uVar49 < 0x100) {
                dVar55 = (double)kLog2Table[uVar49];
              }
              else {
                dVar55 = log2(dVar54);
              }
              local_1a8 = local_1a8 + dVar54 * dVar55;
            }
            bVar53 = true;
            local_1b8 = 0.0;
            uStack_1b0 = 0;
            lVar50 = 0;
            puVar30 = local_188;
            puVar28 = local_188 + 1;
            while( true ) {
              uVar40 = (ulong)*puVar30;
              if (uVar40 < 0x100) {
                dVar54 = (double)kLog2Table[uVar40];
              }
              else {
                dVar54 = log2((double)uVar40);
              }
              s_00 = local_208;
              pBVar26 = local_240;
              uVar49 = lVar50 + uVar40;
              local_1b8 = local_1b8 - (double)uVar40 * dVar54;
              if (!bVar53) break;
              uVar40 = (ulong)*puVar28;
              if (uVar40 < 0x100) {
                dVar54 = (double)kLog2Table[uVar40];
              }
              else {
                dVar54 = log2((double)uVar40);
              }
              lVar50 = uVar49 + uVar40;
              local_1b8 = local_1b8 - (double)uVar40 * dVar54;
              bVar53 = false;
              puVar30 = local_188 + 2;
              puVar28 = local_188 + 3;
            }
            if (uVar49 != 0) {
              auVar58._8_4_ = (int)(uVar49 >> 0x20);
              auVar58._0_8_ = uVar49;
              auVar58._12_4_ = 0x45300000;
              dVar54 = (auVar58._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar49) - 4503599627370496.0);
              if (uVar49 < 0x100) {
                dVar55 = (double)kLog2Table[uVar49];
              }
              else {
                dVar55 = log2(dVar54);
              }
              local_1b8 = local_1b8 + dVar54 * dVar55;
            }
            uVar40 = 0xc;
            local_1e8 = 0.0;
            uStack_1e0 = 0;
            lVar50 = 0;
            while( true ) {
              uVar49 = (ulong)*(uint *)((long)local_188 + uVar40);
              if (uVar49 < 0x100) {
                dVar54 = (double)kLog2Table[uVar49];
              }
              else {
                dVar54 = log2((double)uVar49);
              }
              uVar36 = lVar50 + uVar49;
              local_1e8 = local_1e8 - (double)uVar49 * dVar54;
              if (0x13 < uVar40) break;
              uVar49 = (ulong)*(uint *)((long)local_188 + uVar40 + 4);
              if (uVar49 < 0x100) {
                dVar54 = (double)kLog2Table[uVar49];
              }
              else {
                dVar54 = log2((double)uVar49);
              }
              lVar50 = uVar36 + uVar49;
              local_1e8 = local_1e8 - (double)uVar49 * dVar54;
              uVar40 = uVar40 + 8;
            }
            if (uVar36 != 0) {
              auVar59._8_4_ = (int)(uVar36 >> 0x20);
              auVar59._0_8_ = uVar36;
              auVar59._12_4_ = 0x45300000;
              dVar54 = (auVar59._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar36) - 4503599627370496.0);
              if (uVar36 < 0x100) {
                dVar55 = (double)kLog2Table[uVar36];
              }
              else {
                dVar55 = log2(dVar54);
              }
              local_1e8 = local_1e8 + dVar54 * dVar55;
            }
            local_228 = 0.0;
            for (lVar50 = 0; lVar50 != 3; lVar50 = lVar50 + 1) {
              bVar53 = true;
              dVar54 = 0.0;
              lVar45 = 0;
              uVar40 = 0;
              while( true ) {
                uVar49 = (ulong)*(uint *)((long)&table_size + uVar40 + lVar50 * 0xc);
                dVar55 = (double)uVar49;
                if (uVar49 < 0x100) {
                  dVar56 = (double)kLog2Table[uVar49];
                }
                else {
                  local_1d8 = dVar55;
                  dVar56 = log2(dVar55);
                  dVar55 = local_1d8;
                }
                s_00 = local_208;
                uVar49 = lVar45 + uVar49;
                dVar54 = dVar54 - dVar55 * dVar56;
                if (!bVar53) break;
                uVar40 = (ulong)*(uint *)((long)&table_size + (uVar40 | 4) + lVar50 * 0xc);
                dVar55 = (double)uVar40;
                if (uVar40 < 0x100) {
                  dVar56 = (double)kLog2Table[uVar40];
                }
                else {
                  local_1d8 = dVar55;
                  dVar56 = log2(dVar55);
                  dVar55 = local_1d8;
                }
                lVar45 = uVar49 + uVar40;
                dVar54 = dVar54 - dVar55 * dVar56;
                bVar53 = false;
                uVar40 = 8;
              }
              if (uVar49 != 0) {
                auVar60._8_4_ = (int)(uVar49 >> 0x20);
                auVar60._0_8_ = uVar49;
                auVar60._12_4_ = 0x45300000;
                dVar56 = auVar60._8_8_ - 1.9342813113834067e+25;
                dVar55 = dVar56 + ((double)CONCAT44(0x43300000,(int)uVar49) - 4503599627370496.0);
                if (uVar49 < 0x100) {
                  dVar56 = (double)kLog2Table[uVar49];
                }
                else {
                  local_1d8 = dVar55;
                  dStack_1d0 = dVar56;
                  dVar56 = log2(dVar55);
                  dVar55 = local_1d8;
                }
                dVar54 = dVar54 + dVar55 * dVar56;
              }
              local_228 = local_228 + dVar54;
              pBVar26 = local_240;
            }
            uVar16 = monogram_histo[1] + monogram_histo[0] + monogram_histo[2];
            if (uVar16 == 0) {
              __assert_fail("total != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/encode.c"
                            ,0x168,
                            "void ChooseContextMap(int, uint32_t *, size_t *, const uint32_t **)");
            }
            dVar54 = 1.0 / (double)uVar16;
            dVar55 = local_1a8 * dVar54;
            dVar56 = (local_1b8 + local_1e8) * dVar54;
            if (local_1f0 < 7) {
              local_228 = dVar55 * 10.0;
            }
            else {
              local_228 = local_228 * dVar54;
            }
            if ((0.2 <= dVar55 - dVar56) || (0.2 <= dVar55 - local_228)) {
              if (0.02 <= dVar56 - local_228) {
                puVar31 = ChooseContextMap_kStaticContextMapContinuation;
              }
              else {
                puVar31 = ChooseContextMap_kStaticContextMapSimpleUTF8;
                local_220 = 2;
              }
            }
            else {
              puVar31 = (undefined1 *)0x0;
              local_220 = 1;
            }
          }
          else {
            puVar31 = (undefined1 *)0x0;
          }
          BrotliBuildMetaBlockGreedy
                    (m,(uint8_t *)pHVar4,local_168,sVar61,(uint8_t)local_1ec,(uint8_t)local_190,
                     CONTEXT_UTF8,local_220,(uint32_t *)puVar31,(Command *)local_238,sVar25,
                     (MetaBlockSplit *)&storage_ix);
          literal_context_mode = CONTEXT_UTF8;
          sVar18 = sVar61;
        }
        else {
          sVar18 = sVar61;
          iVar17 = BrotliIsMostlyUTF8((uint8_t *)pHVar4,uVar40,sVar61,uVar39,0.75);
          literal_context_mode = (iVar17 == 0) + CONTEXT_UTF8;
          BrotliBuildMetaBlock
                    (m,(uint8_t *)pHVar4,uVar40,sVar61,&s_00->params,prev_byte,(uint8_t)local_190,
                     (Command *)local_238,sVar25,literal_context_mode,(MetaBlockSplit *)&storage_ix)
          ;
        }
        if (3 < (s_00->params).quality) {
          BrotliOptimizeHistograms
                    (local_158 & 0xffffffff,local_160 & 0xffffffff,(MetaBlockSplit *)&storage_ix);
        }
        uVar40 = local_168;
        BrotliStoreMetaBlock
                  (m,(uint8_t *)pHVar4,local_168,uVar39,sVar18,(uint8_t)local_1ec,(uint8_t)local_190
                   ,is_last,(uint32_t)local_158,(uint32_t)local_160,literal_context_mode,
                   (Command *)local_238,sVar25,(MetaBlockSplit *)&storage_ix,&storage_ix_1,
                   (uint8_t *)pBVar26);
        BrotliDestroyBlockSplit(m,(BlockSplit *)&storage_ix);
        BrotliDestroyBlockSplit(m,&local_e0);
        BrotliDestroyBlockSplit(m,&local_b0);
        BrotliFree(m,local_80);
        local_80 = (uint32_t *)0x0;
        BrotliFree(m,local_70);
        local_70 = (uint32_t *)0x0;
        BrotliFree(m,local_60);
        local_60 = (HistogramLiteral *)0x0;
        BrotliFree(m,local_50);
        local_50 = (HistogramCommand *)0x0;
        BrotliFree(m,local_40);
        uVar43 = local_118;
        psVar52 = local_200;
      }
      sVar61 = sVar18;
      if (storage_ix_1 >> 3 <= uVar39 + 4) goto LAB_0012c1bf;
      uVar13 = *(undefined8 *)((long)local_230 + 8);
      *(undefined8 *)local_218 = local_230->window_mask_;
      *(undefined8 *)(local_218 + 2) = uVar13;
      *(char *)&pBVar26->mode = (char)BVar14;
      storage_ix_1 = uVar43;
    }
    BrotliStoreUncompressedMetaBlock
              (is_last,(uint8_t *)pHVar4,uVar40,sVar18,uVar39,&storage_ix_1,(uint8_t *)pBVar26);
  }
LAB_0012c1bf:
  uVar16 = (uint)sVar61;
  uVar40 = storage_ix_1 >> 3;
  s_00->last_byte_ = *(uint8_t *)((long)&pBVar26->mode + uVar40);
  s_00->last_byte_bits_ = (byte)storage_ix_1 & 7;
  s_00->last_flush_pos_ = s_00->input_pos_;
  iVar17 = UpdateLastProcessedPos(s_00);
  if (iVar17 == 0) goto LAB_0012c691;
  uVar35 = (s_00->params).quality;
  if (9 < (int)uVar35) {
    ((s_00->hashers_).h10)->is_dirty_ = 1;
    goto LAB_0012c691;
  }
  if (uVar35 == 4) {
    if (0xfffff < (s_00->params).size_hint) {
      pHVar23 = (s_00->hashers_).h54;
      pHVar23->is_dirty_ = 1;
      (pHVar23->dict_search_stats_).num_lookups = 0;
      (pHVar23->dict_search_stats_).num_matches = 0;
      goto LAB_0012c691;
    }
switchD_0012c295_caseD_4:
    pHVar7 = (s_00->hashers_).h4;
    pHVar7->is_dirty_ = 1;
    (pHVar7->dict_search_stats_).num_lookups = 0;
    (pHVar7->dict_search_stats_).num_matches = 0;
    goto LAB_0012c691;
  }
  uVar34 = uVar35;
  if ((((int)uVar35 < 5) || (0x10 < (s_00->params).lgwin)) ||
     (uVar34 = 0x2a - (uVar35 < 9), 6 < uVar35)) {
    switch(uVar34) {
    case 2:
      pHVar5 = local_1f8->h2;
      pHVar5->is_dirty_ = 1;
      (pHVar5->dict_search_stats_).num_lookups = 0;
      (pHVar5->dict_search_stats_).num_matches = 0;
      break;
    case 3:
      pHVar9 = (s_00->hashers_).h3;
      pHVar9->is_dirty_ = 1;
      (pHVar9->dict_search_stats_).num_lookups = 0;
      (pHVar9->dict_search_stats_).num_matches = 0;
      break;
    case 4:
      goto switchD_0012c295_caseD_4;
    case 5:
      pHVar10 = (s_00->hashers_).h5;
      pHVar10->is_dirty_ = 1;
      (pHVar10->dict_search_stats_).num_lookups = 0;
      (pHVar10->dict_search_stats_).num_matches = 0;
      break;
    case 6:
      pHVar8 = (s_00->hashers_).h6;
      pHVar8->is_dirty_ = 1;
      (pHVar8->dict_search_stats_).num_lookups = 0;
      (pHVar8->dict_search_stats_).num_matches = 0;
      break;
    case 7:
      pHVar12 = (s_00->hashers_).h7;
      pHVar12->is_dirty_ = 1;
      (pHVar12->dict_search_stats_).num_lookups = 0;
      (pHVar12->dict_search_stats_).num_matches = 0;
      break;
    case 8:
      pHVar24 = (s_00->hashers_).h8;
      pHVar24->is_dirty_ = 1;
      (pHVar24->dict_search_stats_).num_lookups = 0;
      (pHVar24->dict_search_stats_).num_matches = 0;
      break;
    case 9:
      pHVar11 = (s_00->hashers_).h9;
      pHVar11->is_dirty_ = 1;
      (pHVar11->dict_search_stats_).num_lookups = 0;
      (pHVar11->dict_search_stats_).num_matches = 0;
      break;
    default:
      if (uVar34 != 0x29) {
        if (uVar34 == 0x2a) {
          pHVar6 = (s_00->hashers_).h42;
          pHVar6->is_dirty_ = 1;
          (pHVar6->dict_search_stats_).num_lookups = 0;
          (pHVar6->dict_search_stats_).num_matches = 0;
        }
        break;
      }
      pHVar29 = (H40 *)(s_00->hashers_).h41;
      goto LAB_0012c5cd;
    }
  }
  else {
    pHVar29 = (s_00->hashers_).h40;
LAB_0012c5cd:
    pHVar29->is_dirty_ = 1;
    (pHVar29->dict_search_stats_).num_lookups = 0;
    (pHVar29->dict_search_stats_).num_matches = 0;
  }
LAB_0012c691:
  uVar2 = s_00->last_flush_pos_;
  if (uVar2 != 0) {
    s_00->prev_byte_ = *(uint8_t *)((long)pHVar4->addr + (ulong)(uVar16 & (int)uVar2 - 1U));
    if (uVar2 != 1) {
      s_00->prev_byte2_ = *(uint8_t *)((long)pHVar4->addr + (ulong)(uVar16 & (int)uVar2 - 2U));
    }
  }
  *local_210 = 0;
  local_210[1] = 0;
  uVar13 = *(undefined8 *)(local_218 + 2);
  local_230->window_mask_ = *(undefined8 *)local_218;
  *(undefined8 *)((long)local_230 + 8) = uVar13;
  *local_150 = (uint8_t *)pBVar26;
  *psVar52 = uVar40;
  return 1;
code_r0x0012a889:
  lVar45 = lVar45 + -8;
  uVar47 = uVar47 + 1;
  goto LAB_0012a873;
}

Assistant:

static BROTLI_BOOL EncodeData(
    BrotliEncoderState* s, const BROTLI_BOOL is_last,
    const BROTLI_BOOL force_flush, size_t* out_size, uint8_t** output) {
  const uint64_t delta = UnprocessedInputSize(s);
  const uint32_t bytes = (uint32_t)delta;
  const uint32_t wrapped_last_processed_pos =
      WrapPosition(s->last_processed_pos_);
  uint8_t* data;
  uint32_t mask;
  MemoryManager* m = &s->memory_manager_;

  if (!EnsureInitialized(s)) return BROTLI_FALSE;
  data = s->ringbuffer_.buffer_;
  mask = s->ringbuffer_.mask_;

  /* Adding more blocks after "last" block is forbidden. */
  if (s->is_last_block_emitted_) return BROTLI_FALSE;
  if (is_last) s->is_last_block_emitted_ = BROTLI_TRUE;

  if (delta > InputBlockSize(s)) {
    return BROTLI_FALSE;
  }
  if (s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY &&
      !s->command_buf_) {
    s->command_buf_ =
        BROTLI_ALLOC(m, uint32_t, kCompressFragmentTwoPassBlockSize);
    s->literal_buf_ =
        BROTLI_ALLOC(m, uint8_t, kCompressFragmentTwoPassBlockSize);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  }

  if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      s->params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    uint8_t* storage;
    size_t storage_ix = s->last_byte_bits_;
    size_t table_size;
    int* table;

    if (delta == 0 && !is_last) {
      /* We have no new input data and we don't have to finish the stream, so
         nothing to do. */
      *out_size = 0;
      return BROTLI_TRUE;
    }
    storage = GetBrotliStorage(s, 2 * bytes + 502);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = s->last_byte_;
    table = GetHashTable(s, s->params.quality, bytes, &table_size);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    if (s->params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      BrotliCompressFragmentFast(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          table, table_size,
          s->cmd_depths_, s->cmd_bits_,
          &s->cmd_code_numbits_, s->cmd_code_,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    } else {
      BrotliCompressFragmentTwoPass(
          m, &data[wrapped_last_processed_pos & mask],
          bytes, is_last,
          s->command_buf_, s->literal_buf_,
          table, table_size,
          &storage_ix, storage);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    }
    s->last_byte_ = storage[storage_ix >> 3];
    s->last_byte_bits_ = storage_ix & 7u;
    UpdateLastProcessedPos(s);
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }

  {
    /* Theoretical max number of commands is 1 per 2 bytes. */
    size_t newsize = s->num_commands_ + bytes / 2 + 1;
    if (newsize > s->cmd_alloc_size_) {
      Command* new_commands;
      /* Reserve a bit more memory to allow merging with a next block
         without reallocation: that would impact speed. */
      newsize += (bytes / 4) + 16;
      s->cmd_alloc_size_ = newsize;
      new_commands = BROTLI_ALLOC(m, Command, newsize);
      if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
      if (s->commands_) {
        memcpy(new_commands, s->commands_, sizeof(Command) * s->num_commands_);
        BROTLI_FREE(m, s->commands_);
      }
      s->commands_ = new_commands;
    }
  }

  InitOrStitchToPreviousBlock(m, &s->hashers_, data, mask, &s->params,
      wrapped_last_processed_pos, bytes, is_last);
  if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;

  if (s->params.quality == ZOPFLIFICATION_QUALITY) {
    BrotliCreateZopfliBackwardReferences(
        m, bytes, wrapped_last_processed_pos, data, mask,
        &s->params, s->hashers_.h10, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else if (s->params.quality == HQ_ZOPFLIFICATION_QUALITY) {
    BrotliCreateHqZopfliBackwardReferences(
        m, bytes, wrapped_last_processed_pos, data, mask,
        &s->params, s->hashers_.h10, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
  } else {
    BrotliCreateBackwardReferences(
        bytes, wrapped_last_processed_pos, data, mask,
        &s->params, &s->hashers_, s->dist_cache_, &s->last_insert_len_,
        &s->commands_[s->num_commands_], &s->num_commands_, &s->num_literals_);
  }

  {
    const size_t max_length = MaxMetablockSize(&s->params);
    const size_t max_literals = max_length / 8;
    const size_t max_commands = max_length / 8;
    const size_t processed_bytes = (size_t)(s->input_pos_ - s->last_flush_pos_);
    /* If maximal possible additional block doesn't fit metablock, flush now. */
    /* TODO: Postpone decision until next block arrives? */
    const BROTLI_BOOL next_input_fits_metablock = TO_BROTLI_BOOL(
        processed_bytes + InputBlockSize(s) <= max_length);
    /* If block splitting is not used, then flush as soon as there is some
       amount of commands / literals produced. */
    const BROTLI_BOOL should_flush = TO_BROTLI_BOOL(
        s->params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT &&
        s->num_literals_ + s->num_commands_ >= MAX_NUM_DELAYED_SYMBOLS);
    if (!is_last && !force_flush && !should_flush &&
        next_input_fits_metablock &&
        s->num_literals_ < max_literals &&
        s->num_commands_ < max_commands) {
      /* Merge with next input block. Everything will happen later. */
      if (UpdateLastProcessedPos(s)) {
        HashersReset(&s->hashers_, ChooseHasher(&s->params));
      }
      *out_size = 0;
      return BROTLI_TRUE;
    }
  }

  /* Create the last insert-only command. */
  if (s->last_insert_len_ > 0) {
    InitInsertCommand(&s->commands_[s->num_commands_++], s->last_insert_len_);
    s->num_literals_ += s->last_insert_len_;
    s->last_insert_len_ = 0;
  }

  if (!is_last && s->input_pos_ == s->last_flush_pos_) {
    /* We have no new input data and we don't have to finish the stream, so
       nothing to do. */
    *out_size = 0;
    return BROTLI_TRUE;
  }
  assert(s->input_pos_ >= s->last_flush_pos_);
  assert(s->input_pos_ > s->last_flush_pos_ || is_last);
  assert(s->input_pos_ - s->last_flush_pos_ <= 1u << 24);
  {
    const uint32_t metablock_size =
        (uint32_t)(s->input_pos_ - s->last_flush_pos_);
    uint8_t* storage = GetBrotliStorage(s, 2 * metablock_size + 502);
    size_t storage_ix = s->last_byte_bits_;
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    storage[0] = s->last_byte_;
    WriteMetaBlockInternal(
        m, data, mask, s->last_flush_pos_, metablock_size, is_last,
        &s->params, s->prev_byte_, s->prev_byte2_,
        s->num_literals_, s->num_commands_, s->commands_, s->saved_dist_cache_,
        s->dist_cache_, &storage_ix, storage);
    if (BROTLI_IS_OOM(m)) return BROTLI_FALSE;
    s->last_byte_ = storage[storage_ix >> 3];
    s->last_byte_bits_ = storage_ix & 7u;
    s->last_flush_pos_ = s->input_pos_;
    if (UpdateLastProcessedPos(s)) {
      HashersReset(&s->hashers_, ChooseHasher(&s->params));
    }
    if (s->last_flush_pos_ > 0) {
      s->prev_byte_ = data[((uint32_t)s->last_flush_pos_ - 1) & mask];
    }
    if (s->last_flush_pos_ > 1) {
      s->prev_byte2_ = data[(uint32_t)(s->last_flush_pos_ - 2) & mask];
    }
    s->num_commands_ = 0;
    s->num_literals_ = 0;
    /* Save the state of the distance cache in case we need to restore it for
       emitting an uncompressed block. */
    memcpy(s->saved_dist_cache_, s->dist_cache_, sizeof(s->dist_cache_));
    *output = &storage[0];
    *out_size = storage_ix >> 3;
    return BROTLI_TRUE;
  }
}